

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

void ScanFile(ConfigScanner *sc)

{
  _Bool _Var1;
  int iVar2;
  SectionList *pSVar3;
  ConfigScanner *in_RDI;
  ConfigItem *temp;
  SectionList *sec;
  char *section;
  char *in_stack_ffffffffffffffd8;
  ConfigScanner *in_stack_ffffffffffffffe0;
  ConfigScanner *in_stack_ffffffffffffffe8;
  
  if (g_verbose) {
    console_message((char *)0x1982b1);
  }
  if (in_RDI != (ConfigScanner *)0x0) {
    in_RDI->ptr = in_RDI->base;
    in_RDI->current_section_name = (char *)0x0;
    while (*in_RDI->ptr != '\0') {
      in_RDI->vtype = VTYPE_NONE;
      in_RDI->current_key = (char *)0x0;
      SkipSpace(in_RDI);
      _Var1 = isSectionTop(in_RDI);
      if (_Var1) {
        pSVar3 = (SectionList *)ScanSection(in_stack_ffffffffffffffe8);
        if (pSVar3 != (SectionList *)0x0) {
          if ((g_verbose & 1U) != 0) {
            console_message_string((char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
          }
          in_stack_ffffffffffffffe8 = (ConfigScanner *)malloc(0x10);
          in_stack_ffffffffffffffe8->first_section = pSVar3;
          in_stack_ffffffffffffffe8->base = (char *)0x0;
          if (in_RDI->first_section == (SectionList *)0x0) {
            in_RDI->first_section = (SectionList *)in_stack_ffffffffffffffe8;
          }
          else {
            in_RDI->current_section->succ = (SectionList_t *)in_stack_ffffffffffffffe8;
          }
          in_RDI->current_section = (SectionList *)in_stack_ffffffffffffffe8;
        }
      }
      else {
        ScanPair((ConfigScanner *)0x1983cf);
      }
      SkipSpace(in_RDI);
      _Var1 = isBeginningComment(in_RDI);
      if (_Var1) {
        SkipLine(in_stack_ffffffffffffffe0);
      }
      else {
        iVar2 = ScanEol(in_RDI);
        if (iVar2 == 0) {
          return;
        }
      }
      if (in_RDI->current_key != (char *)0x0) {
        in_stack_ffffffffffffffe0 = (ConfigScanner *)malloc(0x28);
        in_stack_ffffffffffffffe0->first_item = (ConfigItem *)in_RDI->current_key;
        *(ValueType *)&in_stack_ffffffffffffffe0->ptr = in_RDI->vtype;
        in_stack_ffffffffffffffe0->first_section = in_RDI->current_section;
        in_stack_ffffffffffffffe0->base = (char *)0x0;
        in_stack_ffffffffffffffd8 = (char *)(ulong)*(ValueType *)&in_stack_ffffffffffffffe0->ptr;
        switch(in_stack_ffffffffffffffd8) {
        case (char *)0x0:
          break;
        case (char *)0x1:
          *(char **)&in_stack_ffffffffffffffe0->current_section = in_RDI->current_string;
          break;
        case (char *)0x2:
          ((ItemValue *)&in_stack_ffffffffffffffe0->current_section)->v_boolean =
               (_Bool)(in_RDI->current_boolean & 1);
          break;
        case (char *)0x3:
          *(long *)&in_stack_ffffffffffffffe0->current_section = in_RDI->current_integer;
          break;
        case (char *)0x4:
          *(double *)&in_stack_ffffffffffffffe0->current_section = in_RDI->current_double;
        }
        if (in_RDI->current_item == (ConfigItem *)0x0) {
          in_RDI->first_item = (ConfigItem *)in_stack_ffffffffffffffe0;
        }
        else {
          in_RDI->current_item->succ = (ConfigItem_t *)in_stack_ffffffffffffffe0;
        }
        in_RDI->current_item = (ConfigItem *)in_stack_ffffffffffffffe0;
      }
    }
  }
  return;
}

Assistant:

void ScanFile(ConfigScanner *sc)
{
	if (g_verbose)
	{
		console_message(u8"設定解析開始\n");
	}

	if (sc == NULL)
	{
		return;
	}
	sc->ptr = sc->base;
	sc->current_section_name = NULL;
	while (*sc->ptr != '\0')
	{
		sc->vtype = VTYPE_NONE;
		sc->current_key = NULL;
		SkipSpace(sc);
		if (isSectionTop(sc))
		{
			char *section = ScanSection(sc);
			if (section)
			{
				if (g_verbose)
				{
					console_message_string(u8"config section： %s\n", section);
				}
				SectionList *sec = (SectionList *)malloc(sizeof(SectionList));
				sec->name = section;
				sec->succ = NULL;
				if (!sc->first_section)
				{
					sc->first_section = sec;
				}
				else
				{
					sc->current_section->succ = sec;
				}
				sc->current_section = sec;
			}
		}
		else
		{
			ScanPair(sc);
		}
		SkipSpace(sc);
		if (isBeginningComment(sc))
		{
			SkipLine(sc);
		}
		else if (!ScanEol(sc))
		{
			break;
		}

		if (sc->current_key != NULL)
		{
			ConfigItem *temp = (ConfigItem *)malloc(sizeof(ConfigItem));
			temp->key = sc->current_key;
			temp->vtype = sc->vtype;
			temp->section = sc->current_section;
			temp->succ = NULL;
			switch (temp->vtype)
			{
			case VTYPE_NONE:
				break;
			case VTYPE_STRING:
				temp->value.v_string = sc->current_string;
				break;
			case VTYPE_BOOLEAN:
				temp->value.v_boolean = sc->current_boolean;
				break;
			case VTYPE_INTEGER:
				temp->value.v_integer = sc->current_integer;
				break;
			case VTYPE_DOUBLE:
				temp->value.v_double = sc->current_double;
				break;
			}

			if (!sc->current_item)
			{
				sc->first_item = temp;
			}
			else
			{
				sc->current_item->succ = temp;
			}
			sc->current_item = temp;
		}
	}
}